

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.hpp
# Opt level: O3

unique_ptr<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>_>
__thiscall
HawkTracer::parser::make_unique<HawkTracer::parser::EventKlass,char_const(&)[9],unsigned_int>
          (parser *this,char (*args) [9],uint *args_1)

{
  EventKlass *this_00;
  size_t sVar1;
  string local_48;
  
  this_00 = (EventKlass *)operator_new(0x68);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  sVar1 = strlen(*args);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,args,*args + sVar1);
  EventKlass::EventKlass(this_00,&local_48,*args_1);
  *(EventKlass **)this = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return (__uniq_ptr_data<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>,_true,_true>
          )(__uniq_ptr_data<HawkTracer::parser::EventKlass,_std::default_delete<HawkTracer::parser::EventKlass>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args)
{
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}